

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.c
# Opt level: O0

void nh_ws_parse(ws_context_t *ctx)

{
  nh_ws_parse_state nVar1;
  uint uVar2;
  char *pcVar3;
  ulong __n;
  uint64_t remain_len;
  uint64_t need_len;
  nh_ws_frame *frame;
  nh_stream_t *stream;
  ws_context_t *ctx_local;
  
  if ((ctx->stream).length < 6) {
    return;
  }
  nVar1 = ctx->parse_state;
  if (nVar1 == PARSE_WS_HEAD) {
    (ctx->frame).fin = ((int)*(ctx->stream).buf & 0x80U) == 0x80;
    (ctx->frame).opcode = *(ctx->stream).buf & 0xf;
    (ctx->stream).index = 1;
    (ctx->frame).mask = ((int)(ctx->stream).buf[1] & 0x80U) == 0x80;
    (ctx->frame).payload_length = (long)(int)((int)(ctx->stream).buf[1] & 0x7f);
    (ctx->stream).index = 2;
    if ((ctx->frame).payload_length == 0x7e) {
      (ctx->frame).payload_length =
           (long)(int)(uint)CONCAT11((ctx->stream).buf[(ctx->stream).index],
                                     (ctx->stream).buf[(ctx->stream).index + 1]);
      (ctx->stream).index = (ctx->stream).index + 2;
    }
    else if ((ctx->frame).payload_length == 0x7f) {
      (ctx->frame).payload_length = *(uint64_t *)((ctx->stream).buf + (ctx->stream).index);
      nh_reverse_endian((char *)&(ctx->frame).payload_length,8);
      (ctx->stream).index = (ctx->stream).index + 8;
    }
    *(undefined4 *)(ctx->frame).masking_key =
         *(undefined4 *)((ctx->stream).buf + (ctx->stream).index);
    (ctx->stream).index = (ctx->stream).index + 4;
    if ((ctx->frame).payload_length == 0) {
      ctx->parse_state = PARSE_WS_DONE;
      return;
    }
    pcVar3 = (char *)malloc((ctx->frame).payload_length + 1);
    (ctx->frame).payload = pcVar3;
    (ctx->frame).payload[(ctx->frame).payload_length] = '\0';
    ctx->parse_state = PARSE_WS_PAYLOAD;
  }
  else if (nVar1 != PARSE_WS_PAYLOAD) {
    if (nVar1 != PARSE_WS_DONE) {
      return;
    }
    goto LAB_00107d25;
  }
  __n = (ctx->frame).payload_length - (ctx->frame).payload_consumed_length;
  uVar2 = (ctx->stream).length - (ctx->stream).index;
  if (uVar2 < __n) {
    memcpy((ctx->frame).payload + (ctx->frame).payload_consumed_length,
           (ctx->stream).buf + (ctx->stream).index,(ulong)uVar2);
    (ctx->frame).payload_consumed_length = (ctx->frame).payload_length;
    (ctx->stream).index = (ctx->stream).index + uVar2;
    return;
  }
  memcpy((ctx->frame).payload + (ctx->frame).payload_consumed_length,
         (ctx->stream).buf + (ctx->stream).index,__n);
  (ctx->frame).payload_consumed_length = (ctx->frame).payload_length;
  (ctx->stream).index = (ctx->stream).index + (int)__n;
  ctx->parse_state = PARSE_WS_DONE;
LAB_00107d25:
  nh_umask((uchar *)(ctx->frame).payload,(ctx->frame).payload_length,(ctx->frame).masking_key);
  nh_stream_free(&ctx->stream);
  return;
}

Assistant:

void nh_ws_parse(ws_context_t *ctx) {
    /**
      0                   1                   2                   3
      0 1 2 3 4 5 6 7 8 9 0 1 2 3 4 5 6 7 8 9 0 1 2 3 4 5 6 7 8 9 0 1
     +-+-+-+-+-------+-+-------------+-------------------------------+
     |F|R|R|R| opcode|M| Payload     |    Extended payload length    |
     |I|S|S|S|  (4)  |A|     (7)     |             (16/64)           |
     |N|V|V|V|       |S|             |   (if payload len==126/127)   |
     | |1|2|3|       |K|             |                               |
     +-+-+-+-+-------+-+-------------+ - - - - - - - - - - - - - - - +
     |     Extended payload length continued, if payload len == 127  |
     + - - - - - - - - - - - - - - - +-------------------------------+
     |                               |Masking-key, if MASK set to 1  |
     +-------------------------------+-------------------------------+
     | Masking-key (continued)       |          Payload Data         |
     +-------------------------------- - - - - - - - - - - - - - - - +
     :                     Payload Data continued ...                :
     + - - - - - - - - - - - - - - - - - - - - - - - - - - - - - - - +
     |                     Payload Data continued ...                |
     +---------------------------------------------------------------+
     **/

    nh_stream_t *stream = &ctx->stream;
    // return if not complete
    if (stream->length < 6) return;

    nh_ws_frame *frame = &ctx->frame;
    uint64_t need_len, remain_len;
    switch (ctx->parse_state) {
        case PARSE_WS_HEAD:
            frame->fin = (stream->buf[0] & 0x80) == 0x80;
            // skip parse RSV1~3
            frame->opcode = stream->buf[0] & 0x0F;
            stream->index = 1;
            frame->mask = (stream->buf[1] & 0x80) == 0X80;
            frame->payload_length = stream->buf[1] & 0x7F;
            stream->index = 2;
            if (frame->payload_length == 126) {
                frame->payload_length = (stream->buf[stream->index] & 0xFF) << 8 |
                                        (stream->buf[stream->index + 1] & 0xFF);
                stream->index += 2;
            } else if (frame->payload_length == 127) {
                memcpy(&(frame->payload_length), &stream->buf[stream->index], 8);
                nh_reverse_endian((char *) &frame->payload_length, 8);
                stream->index += 8;
            }
            memcpy(&(frame->masking_key), &stream->buf[stream->index], 4);
            stream->index += 4;

            if (!frame->payload_length) {
                ctx->parse_state = PARSE_WS_DONE;
                return;
            }
            // prepare payload
            frame->payload = malloc(sizeof(char) * frame->payload_length + 1);
            frame->payload[frame->payload_length] = '\0';
            ctx->parse_state = PARSE_WS_PAYLOAD;
            // fallthrough
        case PARSE_WS_PAYLOAD:
            need_len = frame->payload_length - frame->payload_consumed_length;
            remain_len = stream->length - stream->index;
            if (remain_len < need_len) {
                memcpy(&frame->payload[frame->payload_consumed_length],
                       &stream->buf[stream->index],
                       remain_len);
                frame->payload_consumed_length = frame->payload_length;
                stream->index += remain_len;
                return;
            }
            memcpy(&frame->payload[frame->payload_consumed_length],
                   &stream->buf[stream->index],
                   need_len);
            frame->payload_consumed_length = frame->payload_length;
            stream->index += need_len;
            ctx->parse_state = PARSE_WS_DONE;
            // fallthrough
        case PARSE_WS_DONE:
            nh_umask((unsigned char *) frame->payload, frame->payload_length, frame->masking_key);
            nh_stream_free(&ctx->stream);
            break;
    }
}